

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.h
# Opt level: O0

duration<long,_std::ratio<1L,_1000000L>_> __thiscall
absl::time_internal::ToChronoDuration<std::chrono::duration<long,std::ratio<1l,1000000l>>>
          (time_internal *this,Duration d)

{
  long lVar1;
  bool bVar2;
  int64_t iVar3;
  long lVar4;
  Duration rhs;
  Duration DVar5;
  Duration lhs;
  long local_70;
  int64_t v;
  uint32_t local_60;
  int64_t local_58;
  uint32_t local_50;
  time_internal *local_48;
  undefined4 uStack_40;
  time_internal *local_30;
  undefined4 local_28;
  time_internal *ptStack_20;
  Duration d_local;
  
  DVar5.rep_lo_ = (undefined4)d.rep_hi_;
  DVar5.rep_hi_ = (int64_t)this;
  DVar5._12_4_ = 0;
  local_30 = this;
  local_28 = DVar5.rep_lo_;
  ptStack_20 = this;
  d_local.rep_hi_._0_4_ = DVar5.rep_lo_;
  bVar2 = IsInfiniteDuration(DVar5);
  if (bVar2) {
    local_48 = ptStack_20;
    uStack_40 = (undefined4)d_local.rep_hi_;
    DVar5 = ZeroDuration();
    v = DVar5.rep_hi_;
    local_60 = DVar5.rep_lo_;
    lhs.rep_lo_ = uStack_40;
    lhs.rep_hi_ = (int64_t)local_48;
    rhs._12_4_ = 0;
    rhs.rep_hi_ = SUB128(DVar5._0_12_,0);
    rhs.rep_lo_ = SUB124(DVar5._0_12_,8);
    lhs._12_4_ = 0;
    local_58 = v;
    local_50 = local_60;
    bVar2 = operator<(lhs,rhs);
    if (bVar2) {
      d_local._8_8_ = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::min();
    }
    else {
      d_local._8_8_ = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::max();
    }
  }
  else {
    iVar3 = ToInt64(ptStack_20,(undefined4)d_local.rep_hi_);
    local_70 = iVar3;
    lVar4 = std::numeric_limits<long>::max();
    lVar1 = local_70;
    if (lVar4 < iVar3) {
      d_local._8_8_ = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::max();
    }
    else {
      lVar4 = std::numeric_limits<long>::min();
      if (lVar1 < lVar4) {
        d_local._8_8_ = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::min();
      }
      else {
        std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<long,void>
                  ((duration<long,std::ratio<1l,1000000l>> *)&d_local.rep_lo_,&local_70);
      }
    }
  }
  return (duration<long,_std::ratio<1L,_1000000L>_>)d_local._8_8_;
}

Assistant:

T ToChronoDuration(Duration d) {
  using Rep = typename T::rep;
  using Period = typename T::period;
  static_assert(IsValidRep64<Rep>(0), "duration::rep is invalid");
  if (time_internal::IsInfiniteDuration(d))
    return d < ZeroDuration() ? (T::min)() : (T::max)();
  const auto v = ToInt64(d, Period{});
  if (v > (std::numeric_limits<Rep>::max)()) return (T::max)();
  if (v < (std::numeric_limits<Rep>::min)()) return (T::min)();
  return T{v};
}